

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseSnapshot.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall DatabaseSnapshot::find_compact_candidate_abi_cxx11_(DatabaseSnapshot *this,bool smart)

{
  string_view_t fmt;
  string_view dataset_id;
  bool bVar1;
  uint64_t uVar2;
  basic_string_view<char> *pbVar3;
  iterator iVar4;
  iterator iVar5;
  size_type sVar6;
  ulong uVar7;
  long lVar8;
  byte in_DL;
  long in_RSI;
  ConfigKey *in_RDI;
  undefined1 auVar9 [16];
  OnDiskDataset **ds;
  iterator __end1_1;
  iterator __begin1_1;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *__range1_1;
  int64_t compact_value;
  uint64_t avg_files;
  OnDiskDataset **candidate_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *__range2_1;
  uint64_t number_of_files;
  OnDiskDataset **candidate;
  iterator __end2;
  iterator __begin2;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *__range2;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> ready_candidates;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> candidates;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *set;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
  *__range1;
  int64_t best_compact_value;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> best_compact;
  uint64_t max_files;
  uint64_t max_datasets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *names;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *in_stack_fffffffffffffd28;
  basic_string_view<char> *in_stack_fffffffffffffd30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd47;
  char *in_stack_fffffffffffffd48;
  uint64_t in_stack_fffffffffffffd50;
  undefined6 in_stack_fffffffffffffd58;
  byte in_stack_fffffffffffffd5e;
  undefined1 in_stack_fffffffffffffd5f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd60;
  ConfigKey *this_00;
  string local_250 [32];
  reference local_230;
  unordered_map<unsigned_long,_TaskSpec,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>_>
  *in_stack_fffffffffffffdd8;
  __normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
  in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  OnDiskDataset *in_stack_fffffffffffffe38;
  __normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
  local_1b8;
  char *local_1b0;
  basic_string_view<char> *local_1a8;
  string local_1a0 [32];
  undefined1 local_180 [16];
  reference local_170;
  OnDiskDataset **local_168;
  __normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
  local_160;
  undefined1 *local_158;
  char local_150 [8];
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *in_stack_fffffffffffffeb8;
  undefined1 local_120 [8];
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *in_stack_fffffffffffffee8;
  __normal_iterator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_*,_std::vector<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>_>
  local_f0;
  undefined1 local_e8 [24];
  undefined1 *local_d0;
  long local_c8;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> local_c0 [3];
  basic_string_view<char> *local_70;
  uint64_t local_20;
  byte local_11;
  
  local_11 = in_DL & 1;
  this_00 = in_RDI;
  ConfigKey::merge_max_datasets();
  uVar2 = DatabaseConfig::get((DatabaseConfig *)this_00,in_RDI);
  ConfigKey::~ConfigKey((ConfigKey *)0x16b0ef);
  local_20 = uVar2;
  ConfigKey::merge_max_files();
  pbVar3 = (basic_string_view<char> *)DatabaseConfig::get((DatabaseConfig *)this_00,in_RDI);
  ConfigKey::~ConfigKey((ConfigKey *)0x16b144);
  local_70 = pbVar3;
  std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::vector
            ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)0x16b15e);
  local_c8 = std::numeric_limits<long>::min();
  OnDiskDataset::get_compatible_datasets(in_stack_fffffffffffffee8);
  local_d0 = local_e8;
  local_f0._M_current =
       (vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
       std::
       vector<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
       ::begin((vector<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
                *)in_stack_fffffffffffffd28);
  std::
  vector<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
  ::end((vector<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
         *)in_stack_fffffffffffffd28);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_*,_std::vector<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>_>
                        *)in_stack_fffffffffffffd30,
                       (__normal_iterator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_*,_std::vector<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>_>
                        *)in_stack_fffffffffffffd28);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_*,_std::vector<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>_>
    ::operator*(&local_f0);
    std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::vector
              ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)0x16b281);
    if ((local_11 & 1) == 0) {
      std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::operator=
                ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                 CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                 (vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                 in_stack_fffffffffffffd38);
    }
    else {
      OnDiskDataset::get_compact_candidates(in_stack_fffffffffffffeb8);
      std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::operator=
                ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                 CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                 (vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                 in_stack_fffffffffffffd38);
      std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::~vector
                ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                 CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
    }
    std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::vector
              ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)0x16b301);
    local_158 = local_120;
    local_160._M_current =
         (OnDiskDataset **)
         std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::begin
                   (in_stack_fffffffffffffd28);
    local_168 = (OnDiskDataset **)
                std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::end
                          (in_stack_fffffffffffffd28);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                          *)in_stack_fffffffffffffd30,
                         (__normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                          *)in_stack_fffffffffffffd28);
      if (!bVar1) break;
      local_170 = __gnu_cxx::
                  __normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                  ::operator*(&local_160);
      in_stack_fffffffffffffd60 =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(in_RSI + 0x138);
      OnDiskDataset::get_id_abi_cxx11_(in_stack_fffffffffffffe38);
      auVar9 = std::__cxx11::string::operator_cast_to_basic_string_view(local_1a0);
      dataset_id._M_str = in_stack_fffffffffffffde8;
      dataset_id._M_len = (size_t)in_stack_fffffffffffffde0._M_current;
      local_180 = auVar9;
      in_stack_fffffffffffffd5f = is_dataset_locked(in_stack_fffffffffffffdd8,dataset_id);
      in_stack_fffffffffffffd5e = in_stack_fffffffffffffd5f ^ 0xff;
      std::__cxx11::string::~string(local_1a0);
      if ((in_stack_fffffffffffffd5e & 1) != 0) {
        std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::push_back
                  ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                   CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                   (value_type *)in_stack_fffffffffffffd38);
      }
      __gnu_cxx::
      __normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
      ::operator++(&local_160);
    }
    local_1a8 = (basic_string_view<char> *)0x0;
    local_1b0 = local_150;
    local_1b8._M_current =
         (OnDiskDataset **)
         std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::begin
                   (in_stack_fffffffffffffd28);
    std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::end
              (in_stack_fffffffffffffd28);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                          *)in_stack_fffffffffffffd30,
                         (__normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                          *)in_stack_fffffffffffffd28);
      if (!bVar1) break;
      in_stack_fffffffffffffe38 =
           (OnDiskDataset *)
           __gnu_cxx::
           __normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
           ::operator*(&local_1b8);
      in_stack_fffffffffffffd50 = OnDiskDataset::get_file_count((OnDiskDataset *)0x16b4eb);
      local_1a8 = (basic_string_view<char> *)
                  ((long)&(((_Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                             *)&local_1a8->data_)->_M_impl).super__Vector_impl_data._M_start +
                  in_stack_fffffffffffffd50);
      __gnu_cxx::
      __normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
      ::operator++(&local_1b8);
    }
    in_stack_fffffffffffffd48 = local_150;
    iVar4 = std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::begin
                      (in_stack_fffffffffffffd28);
    iVar5 = std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::end
                      (in_stack_fffffffffffffd28);
    std::
    sort<__gnu_cxx::__normal_iterator<OnDiskDataset_const**,std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>>,DatabaseSnapshot::find_compact_candidate[abi:cxx11](bool)const::__0>
              (iVar4._M_current,iVar5._M_current);
    while( true ) {
      sVar6 = std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::size
                        ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                         local_150);
      in_stack_fffffffffffffd47 = local_20 < sVar6 || local_70 < local_1a8;
      if (local_20 >= sVar6 && local_70 >= local_1a8) break;
      std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::back
                ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                 in_stack_fffffffffffffd30);
      in_stack_fffffffffffffd38 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           OnDiskDataset::get_file_count((OnDiskDataset *)0x16b5b1);
      local_1a8 = (basic_string_view<char> *)((long)local_1a8 - (long)in_stack_fffffffffffffd38);
      std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::pop_back
                ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)0x16b5dd);
    }
    sVar6 = std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::size
                      ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                       local_150);
    if (1 < sVar6) {
      in_stack_fffffffffffffd30 = local_1a8;
      sVar6 = std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::size
                        ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                         local_150);
      uVar7 = (ulong)in_stack_fffffffffffffd30 / sVar6;
      sVar6 = std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::size
                        ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                         local_150);
      lVar8 = sVar6 - uVar7;
      if (local_c8 < lVar8) {
        local_c8 = lVar8;
        std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::operator=
                  ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                   CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                   (vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                   in_stack_fffffffffffffd38);
      }
    }
    std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::~vector
              ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
               CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
    std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::~vector
              ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
               CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
    __gnu_cxx::
    __normal_iterator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_*,_std::vector<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>_>
    ::operator++(&local_f0);
  }
  std::
  vector<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
  ::~vector((vector<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
             *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
  bVar1 = std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::empty
                    ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                     CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
  if (bVar1) {
    spdlog::debug<char[37]>((char (*) [37])0x16b71b);
  }
  else {
    ::fmt::v6::basic_string_view<char>::basic_string_view
              (in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28);
    std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::size(local_c0);
    fmt.size_ = in_stack_fffffffffffffd50;
    fmt.data_ = in_stack_fffffffffffffd48;
    spdlog::debug<long,unsigned_long>
              (fmt,(long *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
               (unsigned_long *)in_stack_fffffffffffffd38);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x16b785);
  std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::size(local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(in_stack_fffffffffffffd60,
            CONCAT17(in_stack_fffffffffffffd5f,
                     CONCAT16(in_stack_fffffffffffffd5e,in_stack_fffffffffffffd58)));
  std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::begin
            (in_stack_fffffffffffffd28);
  std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::end
            (in_stack_fffffffffffffd28);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                        *)in_stack_fffffffffffffd30,
                       (__normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                        *)in_stack_fffffffffffffd28);
    if (!bVar1) break;
    local_230 = __gnu_cxx::
                __normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                ::operator*((__normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                             *)&stack0xfffffffffffffde0);
    OnDiskDataset::get_id_abi_cxx11_(in_stack_fffffffffffffe38);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
               in_stack_fffffffffffffd38);
    std::__cxx11::string::~string(local_250);
    __gnu_cxx::
    __normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
    ::operator++((__normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                  *)&stack0xfffffffffffffde0);
  }
  std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::~vector
            ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
             CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this_00;
}

Assistant:

std::vector<std::string> DatabaseSnapshot::find_compact_candidate(
    bool smart) const {
    const uint64_t max_datasets = config.get(ConfigKey::merge_max_datasets());
    const uint64_t max_files = config.get(ConfigKey::merge_max_files());

    // Try to find a best compact candidate. As a rating function, we use
    // "number of datasets" - "average number of files", because we want to
    // maximise number of datasets being compacted and minimise number of
    // files being compacted (we want to compact small datasets first).
    std::vector<const OnDiskDataset *> best_compact;
    int64_t best_compact_value = std::numeric_limits<int64_t>::min();
    for (auto &set : OnDiskDataset::get_compatible_datasets(datasets)) {
        // Check every set of compatible datasets.
        std::vector<const OnDiskDataset *> candidates;
        if (smart) {
            // When we're trying to be smart, ignore too small sets.
            candidates = std::move(OnDiskDataset::get_compact_candidates(set));
        } else {
            candidates = std::move(set);
        }

        // Ignore datasets that are locked.
        std::vector<const OnDiskDataset *> ready_candidates;
        for (const auto &candidate : candidates) {
            if (!is_dataset_locked(tasks, candidate->get_id())) {
                ready_candidates.push_back(candidate);
            }
        }

        // Compute number of files in this dataset.
        uint64_t number_of_files = 0;
        for (const auto &candidate : ready_candidates) {
            number_of_files += candidate->get_file_count();
        }

        // Check for allowed maximum merge values. If they are exceeded, try to
        // merge small datasets first.
        std::sort(ready_candidates.begin(), ready_candidates.end(),
                  [](const auto &lhs, const auto &rhs) {
                      return lhs->get_file_count() < rhs->get_file_count();
                  });
        while (ready_candidates.size() > max_datasets ||
               number_of_files > max_files) {
            number_of_files -= ready_candidates.back()->get_file_count();
            ready_candidates.pop_back();
        }

        // It doesn't make sense to merge less than 2 datasets.
        if (ready_candidates.size() < 2) {
            continue;
        }

        // Compute compact_value for this set, and maybe update best candidate.
        uint64_t avg_files = number_of_files / ready_candidates.size();
        int64_t compact_value = ready_candidates.size() - avg_files;
        if (compact_value > best_compact_value) {
            best_compact_value = compact_value;
            best_compact = std::move(ready_candidates);
        }
    }

    if (best_compact.empty()) {
        spdlog::debug("No suitable compact candidate found.");
    } else {
        spdlog::debug("Good candidate (cost: {}, datasets: {}).",
                      best_compact_value, best_compact.size());
    }

    std::vector<std::string> names;
    names.reserve(best_compact.size());
    for (const auto &ds : best_compact) {
        names.emplace_back(ds->get_id());
    }

    return names;
}